

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureStructTest::getShaderBody
          (XFBCaptureStructTest *this,GLuint test_case_index,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  TestError *this_00;
  char *local_30;
  GLchar *assignments;
  string *out_calculations_local;
  string *out_assignments_local;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBCaptureStructTest *this_local;
  
  std::__cxx11::string::operator=((string *)out_calculations,"");
  local_30 = "";
  switch(stage) {
  case VERTEX:
    if (test_case_index == 0) {
      local_30 = getShaderBody::vs_tes_gs;
    }
    break;
  case TESS_CTRL:
    break;
  case TESS_EVAL:
    if (test_case_index == 1) {
      local_30 = getShaderBody::vs_tes_gs;
    }
    break;
  case GEOMETRY:
    if (test_case_index == 2) {
      local_30 = getShaderBody::vs_tes_gs;
    }
    break;
  case FRAGMENT:
    local_30 = getShaderBody::fs;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x69a9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator=((string *)out_assignments,local_30);
  return;
}

Assistant:

void XFBCaptureStructTest::getShaderBody(GLuint test_case_index, Utils::Shader::STAGES stage,
										 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	static const GLchar* vs_tes_gs = "    goku.chichi = uni_chichi;\n"
									 "    goku.gohan  = uni_gohan;\n";
	static const GLchar* fs = "    fs_out = goku.goten + goku.gohan + goku.chichi;\n";

	const GLchar* assignments = "";

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;

	case Utils::Shader::GEOMETRY:
		if (TEST_GS == test_case_index)
		{
			assignments = vs_tes_gs;
		}
		break;

	case Utils::Shader::TESS_CTRL:
		break;

	case Utils::Shader::TESS_EVAL:
		if (TEST_TES == test_case_index)
		{
			assignments = vs_tes_gs;
		}
		break;

	case Utils::Shader::VERTEX:
		if (TEST_VS == test_case_index)
		{
			assignments = vs_tes_gs;
		}
		break;

	default:
		TCU_FAIL("Invalid enum");
	}

	out_assignments = assignments;
}